

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  _Base_ptr p_Var2;
  LogMessage *pLVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  LogFinisher local_59;
  LogMessage local_58;
  
  p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var4->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (number <= (int)p_Var2[1]._M_color) {
        p_Var5 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < number];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var4) && ((int)p_Var5[1]._M_color <= number))
    goto LAB_001ffed3;
  }
  LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
             ,0x19d);
  pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: iter != extensions_.end(): ");
  pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
  LogFinisher::operator=(&local_59,pLVar3);
  LogMessage::~LogMessage(&local_58);
  p_Var5 = &p_Var4->_M_header;
LAB_001ffed3:
  if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x19e);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  bVar1 = *(byte *)&p_Var5[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x19e);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_STRING): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  p_Var2 = p_Var5[1]._M_parent;
  if (*(int *)&p_Var2->_M_parent <= index) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x340);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: (index) < (size()): ");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  return *(string **)(*(long *)p_Var2 + (long)index * 8);
}

Assistant:

string* ExtensionSet::MutableRepeatedString(int number, int index) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, STRING);
  return iter->second.repeated_string_value->Mutable(index);
}